

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O0

SymbolInfo *
ZXing::Pdf417::ReadSymbolInfo<ZXing::PointT<double>>
          (BitMatrixCursor<ZXing::PointT<double>_> topCur,PointT<double> rowSkip,int colWidth,
          int width,int height)

{
  PointT<double> p;
  bool bVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  BitMatrixCursor<ZXing::PointT<double>_> *in_RDI;
  double dVar3;
  PointT<double> PVar4;
  array<unsigned_short,_8UL> aVar5;
  CodeWord cw;
  BitMatrixCursor<ZXing::PointT<double>_> cur;
  BitMatrixCursor<ZXing::PointT<double>_> startCur;
  int rows1;
  int rows0;
  int clusterMask;
  int in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  uint uVar6;
  BitMatrixCursor<ZXing::PointT<double>_> *pBVar7;
  undefined1 *__src;
  CodeWord in_stack_ffffffffffffff28;
  CodeWord in_stack_ffffffffffffff30;
  CodeWord CVar8;
  undefined1 auVar9 [12];
  PatternView *in_stack_ffffffffffffff48;
  undefined1 local_98 [40];
  PointT<double> local_70;
  undefined1 local_60 [8];
  PointT<double> PStack_58;
  int in_stack_ffffffffffffffc4;
  int local_28;
  int local_24;
  uint local_20;
  PointT<double> local_10;
  
  __src = &stack0x00000008;
  *(int *)&in_RDI->img = in_EDX;
  *(int *)((long)&in_RDI->img + 4) = in_ECX;
  *(int *)&(in_RDI->p).x = 0;
  *(int *)((long)&(in_RDI->p).x + 4) = 0;
  *(int *)&(in_RDI->p).y = -1;
  *(int *)((long)&(in_RDI->p).y + 4) = -1;
  *(int *)&(in_RDI->d).x = -1;
  *(int *)((long)&(in_RDI->d).x + 4) = 0;
  *(float *)&(in_RDI->d).y = 0.0;
  *(int *)((long)&(in_RDI->d).x + 4) = in_ESI;
  local_20 = 0;
  local_24 = 0;
  local_28 = 0;
  pBVar7 = in_RDI;
  PVar4 = ZXing::operator*((float)((ulong)in_RDI >> 0x20),
                           (PointT<double> *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  PointT<double>::operator+=
            ((PointT<double> *)(__src + 8),(PointT<double> *)&stack0xffffffffffffffc8);
  memcpy(local_60,__src,0x28);
  while( true ) {
    uVar6 = in_stack_ffffffffffffff0c & 0xffffff;
    if (local_20 != 7) {
      local_70 = operator-<double,_double>
                           ((PointT<double> *)in_RDI,
                            (PointT<double> *)
                            (CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08) &
                            0xffffffffffffff));
      p.y = (double)__src;
      p.x = (double)pBVar7;
      dVar3 = maxAbsComponent<double>(p);
      uVar6 = CONCAT13(dVar3 < (double)(in_ECX / 2),(int3)uVar6);
    }
    in_stack_ffffffffffffff0c = uVar6;
    if ((char)(in_stack_ffffffffffffff0c >> 0x18) == '\0') break;
    memcpy(local_98,local_60,0x28);
    aVar5 = BitMatrixCursor<ZXing::PointT<double>>::
            readPatternFromBlack<std::array<unsigned_short,8ul>>
                      (in_RDI,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
    auVar9 = aVar5._M_elems._4_12_;
    PatternView::PatternView<8ul>
              ((PatternView *)in_RDI,
               (Pattern<8UL> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    dVar3 = IsPattern<false,8,17>
                      (in_stack_ffffffffffffff48,auVar9._4_8_,auVar9._0_4_,
                       (double)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
    if (dVar3 == 0.0) break;
    in_stack_ffffffffffffff30 =
         ReadCodeWord<ZXing::PointT<double>>
                   ((BitMatrixCursor<ZXing::PointT<double>_> *)PVar4.x,in_stack_ffffffffffffffc4);
    bVar1 = CodeWord::operator_cast_to_bool((CodeWord *)&stack0xffffffffffffff30);
    if (bVar1) {
      if (*(int *)&(in_RDI->p).y == -1) {
        CVar8 = in_stack_ffffffffffffff30;
        iVar2 = Row(in_stack_ffffffffffffff30);
        *(int *)&(in_RDI->p).y = iVar2;
        in_stack_ffffffffffffff28 = in_stack_ffffffffffffff30;
        in_stack_ffffffffffffff30 = CVar8;
      }
      in_stack_ffffffffffffff08 = in_stack_ffffffffffffff30.cluster;
      iVar2 = in_stack_ffffffffffffff30.code;
      if (in_stack_ffffffffffffff08 == 0) {
        local_24 = iVar2 % 0x1e;
      }
      else if (in_stack_ffffffffffffff08 == 3) {
        local_28 = iVar2 % 3;
        *(int *)&(in_RDI->d).x =
             (int)((long)((ulong)(uint)((int)((long)iVar2 % 0x1e) >> 0x1f) << 0x20 |
                         (long)iVar2 % 0x1e & 0xffffffffU) / 3);
      }
      else {
        if (in_stack_ffffffffffffff08 != 6) goto LAB_002ce174;
        *(int *)((long)&(in_RDI->p).x + 4) = iVar2 % 0x1e + 1;
      }
      local_20 = 1 << ((byte)(in_stack_ffffffffffffff08 / 3) & 0x1f) | local_20;
    }
LAB_002ce174:
    PointT<double>::operator+=(&PStack_58,&local_10);
  }
  if ((local_20 & 3) == 3) {
    *(int *)&(in_RDI->p).x = local_24 * 3 + local_28 + 1;
  }
  return (SymbolInfo *)pBVar7;
}

Assistant:

SymbolInfo ReadSymbolInfo(BitMatrixCursor<POINT> topCur, POINT rowSkip, int colWidth, int width, int height)
{
	SymbolInfo res = {width, height};
	res.colWidth = colWidth;
	int clusterMask = 0;
	int rows0 = 0, rows1 = 0; // Suppress GNUC -Wmaybe-uninitialized

	topCur.p += .5f * rowSkip;

	for (auto startCur = topCur; clusterMask != 0b111 && maxAbsComponent(topCur.p - startCur.p) < height / 2; startCur.p += rowSkip) {
		auto cur = startCur;
		if (!IsPattern(cur.template readPatternFromBlack<Pattern417>(1, colWidth + 2), START_PATTERN))
			break;
		auto cw = ReadCodeWord(cur);
#ifdef PRINT_DEBUG
		printf("%3dx%3d:%2d: %4d.%d \n", int(cur.p.x), int(cur.p.y), Row(cw), cw.code, cw.cluster);
		fflush(stdout);
#endif
		if (!cw)
			continue;
		if (res.firstRow == -1)
			res.firstRow = Row(cw);
		switch (cw.cluster) {
		case 0: rows0 = cw.code % 30; break;
		case 3: rows1 = cw.code % 3, res.ecLevel = (cw.code % 30) / 3; break;
		case 6: res.nCols = (cw.code % 30) + 1; break;
		default: continue;
		}
		clusterMask |= (1 << cw.cluster / 3);
	}
	if ((clusterMask & 0b11) == 0b11)
		res.nRows = 3 * rows0 + rows1 + 1;
	return res;
}